

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdGetTxInWitnessCountByHandle
              (void *handle,void *tx_data_handle,int stack_type,uint32_t txin_index,uint32_t *count)

{
  ByteData *pBVar1;
  ConfidentialTransaction *this;
  uint32_t uVar2;
  CfdException *pCVar3;
  ScriptWitness *this_00;
  bool is_bitcoin;
  TxInReference ref;
  bool local_1b5;
  int local_1b4;
  undefined1 local_1b0 [32];
  ConfidentialTxInReference local_190;
  
  local_1b4 = stack_type;
  cfd::Initialize();
  pBVar1 = &local_190.super_AbstractTxInReference.txid_.data_;
  local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"TransactionData","");
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&local_190);
  if ((ByteData *)local_190.super_AbstractTxInReference._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(local_190.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  local_1b5 = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&local_1b5);
  this = *(ConfidentialTransaction **)((long)tx_data_handle + 0x18);
  if (this == (ConfidentialTransaction *)0x0) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"Invalid handle state. tx is null","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&local_190);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_1b5 == true) {
    cfd::core::Transaction::GetTxIn((TxInReference *)&local_190,(Transaction *)this,txin_index);
    if (local_1b4 == 0) {
      if (count != (uint32_t *)0x0) {
        uVar2 = cfd::core::ScriptWitness::GetWitnessNum
                          (&local_190.super_AbstractTxInReference.script_witness_);
        *count = uVar2;
      }
      cfd::core::AbstractTxInReference::~AbstractTxInReference
                (&local_190.super_AbstractTxInReference);
      return 0;
    }
    local_1b0._0_8_ = "cfdcapi_transaction.cpp";
    local_1b0._8_4_ = 0xf51;
    local_1b0._16_8_ = "CfdGetTxInWitnessCountByHandle";
    cfd::core::logger::log<int&>
              ((CfdSourceLocation *)local_1b0,kCfdLogLevelWarning,"Invalid stack type[{}]",
               &local_1b4);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1b0._0_8_ = local_1b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Invalid stack type.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_1b0);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::ConfidentialTransaction::GetTxIn(&local_190,this,txin_index);
  if (local_1b4 == 1) {
    if (count == (uint32_t *)0x0) goto LAB_004465ed;
    this_00 = &local_190.pegin_witness_;
  }
  else {
    if (local_1b4 != 0) {
      local_1b0._0_8_ = "cfdcapi_transaction.cpp";
      local_1b0._8_4_ = 0xf60;
      local_1b0._16_8_ = "CfdGetTxInWitnessCountByHandle";
      cfd::core::logger::log<int&>
                ((CfdSourceLocation *)local_1b0,kCfdLogLevelWarning,"Invalid stack type[{}]",
                 &local_1b4);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Invalid stack type.","");
      cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_1b0);
      __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (count == (uint32_t *)0x0) goto LAB_004465ed;
    this_00 = &local_190.super_AbstractTxInReference.script_witness_;
  }
  uVar2 = cfd::core::ScriptWitness::GetWitnessNum(this_00);
  *count = uVar2;
LAB_004465ed:
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_190);
  return 0;
}

Assistant:

int CfdGetTxInWitnessCountByHandle(
    void* handle, void* tx_data_handle, int stack_type, uint32_t txin_index,
    uint32_t* count) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      const TxInReference ref = tx->GetTxIn(txin_index);
      if (stack_type != kCfdTxWitnessStackNormal) {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
      if (count != nullptr) *count = ref.GetScriptWitnessStackNum();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      const ConfidentialTxInReference ref = tx->GetTxIn(txin_index);
      if (stack_type == kCfdTxWitnessStackNormal) {
        if (count != nullptr) *count = ref.GetScriptWitnessStackNum();
      } else if (stack_type == kCfdTxWitnessStackPegin) {
        if (count != nullptr) *count = ref.GetPeginWitnessStackNum();
      } else {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}